

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_util.cc
# Opt level: O2

void google::protobuf::internal::PackedFieldHelper<9>::
     Serialize<google::protobuf::internal::ArrayOutput>
               (void *field,FieldMetadata *md,ArrayOutput *output)

{
  LogMessage *pLVar1;
  LogFinisher local_49;
  LogMessage local_48;
  
  LogMessage::LogMessage
            (&local_48,LOGLEVEL_FATAL,
             "/workspace/llm4binary/github/license_c_cmakelists/google[P]bloaty/third_party/protobuf/src/google/protobuf/generated_message_util.cc"
             ,0x205);
  pLVar1 = LogMessage::operator<<(&local_48,"Not implemented field number ");
  pLVar1 = LogMessage::operator<<(pLVar1,md->tag);
  pLVar1 = LogMessage::operator<<(pLVar1," with type ");
  pLVar1 = LogMessage::operator<<(pLVar1,md->type);
  LogFinisher::operator=(&local_49,pLVar1);
  LogMessage::~LogMessage(&local_48);
  return;
}

Assistant:

static void Serialize(const void* field, const FieldMetadata& md, O* output) {
    GOOGLE_LOG(FATAL) << "Not implemented field number " << md.tag << " with type "
               << md.type;
  }